

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::erase_selected_joint(Scene *this)

{
  long in_RDI;
  Joint *j;
  Scene *in_stack_00000098;
  Joint *in_stack_000000a0;
  Selection *local_28;
  
  if (*(long *)(in_RDI + 0x30) != 0) {
    if (*(long *)(in_RDI + 0x30) == 0) {
      local_28 = (Selection *)0x0;
    }
    else {
      local_28 = (Selection *)
                 __dynamic_cast(*(long *)(in_RDI + 0x30),&SceneObject::typeinfo,&Joint::typeinfo,0);
    }
    if (local_28 != (Selection *)0x0) {
      Joint::removeJoint(in_stack_000000a0,in_stack_00000098);
      Selection::clear(local_28);
    }
  }
  return;
}

Assistant:

void Scene::erase_selected_joint() {
  if (selected.object == nullptr) return;
  Joint *j = dynamic_cast<Joint *>(selected.object);
  if (j) {
    j->removeJoint(this);
    selected.clear();
  }
}